

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O3

int64_t primecount::pi_lmo2(int64_t x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  size_t sVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  bool *pbVar55;
  bool bVar56;
  ulong uVar57;
  size_t n;
  ulong uVar58;
  long lVar59;
  long lVar60;
  size_t sVar61;
  long res;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  int64_t iVar65;
  long lVar66;
  ulong uVar67;
  int64_t k_1;
  long lVar68;
  long lVar69;
  long lVar70;
  bool *pbVar71;
  ulong uVar72;
  ulong uVar73;
  long lVar74;
  double dVar75;
  double dVar76;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  int iVar116;
  int iVar121;
  int iVar122;
  undefined1 auVar117 [16];
  int iVar123;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  int iVar149;
  int iVar156;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  type primes;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  Vector<bool,_std::allocator<bool>_> sieve;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  Vector<int,_std::allocator<int>_> local_c0;
  ulong local_a8;
  int64_t local_a0;
  int *local_98;
  long local_90;
  long local_88;
  long local_80;
  Vector<int,_std::allocator<int>_> local_78;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<bool,_std::allocator<bool>_> local_48;
  
  if (x < 2) {
    iVar65 = 0;
  }
  else {
    auVar77._8_8_ = in_stack_fffffffffffffef0;
    auVar77._0_8_ = in_stack_fffffffffffffee8;
    dVar75 = get_alpha_lmo((primecount *)x,(maxint_t)auVar77);
    dVar76 = cbrt((double)x);
    uVar62 = (ulong)dVar76;
    if (0 < (long)uVar62) {
      do {
        if (uVar62 * uVar62 - (ulong)x / uVar62 == 0 ||
            (long)(uVar62 * uVar62) < (long)((ulong)x / uVar62)) goto LAB_00119073;
        bVar56 = 1 < (long)uVar62;
        uVar62 = uVar62 - 1;
      } while (bVar56);
      uVar62 = 0;
    }
LAB_00119073:
    lVar63 = uVar62 - 1;
    do {
      lVar74 = lVar63 + 2;
      lVar63 = lVar63 + 1;
    } while (lVar74 * lVar74 - x / lVar74 == 0 || lVar74 * lVar74 < x / lVar74);
    auVar78._0_8_ = dVar75 * (double)lVar63;
    auVar78._8_8_ = 0;
    uVar62 = (ulong)auVar78._0_8_;
    uVar72 = 8;
    if (uVar62 < 0x14) {
      uVar72 = (ulong)(byte)(&PhiTiny::pi)[uVar62];
    }
    generate_primes_i32(&local_c0,uVar62);
    generate_lpf(&local_60,uVar62);
    generate_moebius(&local_78,uVar62);
    lVar63 = (long)local_c0.end_ - (long)local_c0.array_;
    bVar56 = is_print();
    lVar63 = (lVar63 >> 2) + -1;
    uVar57 = P2(x,uVar62,lVar63,1,bVar56);
    bVar56 = is_print();
    local_a0 = S1(x,uVar62,uVar72,1,bVar56);
    n = x / (long)uVar62;
    local_48.array_ = (bool *)0x0;
    local_48.end_ = (bool *)0x0;
    local_48.capacity_ = (bool *)0x0;
    local_a8 = uVar57;
    Vector<bool,_std::allocator<bool>_>::resize(&local_48,n);
    pbVar55 = local_48.array_;
    auVar77 = extraout_XMM0;
    if (local_48.array_ != local_48.end_) {
      memset(local_48.array_,1,(long)local_48.end_ - (long)local_48.array_);
      auVar77 = extraout_XMM0_00;
    }
    auVar54 = _DAT_00151b40;
    auVar53 = _DAT_00151b30;
    auVar52 = _DAT_00151b20;
    auVar51 = _DAT_00151b10;
    auVar50 = _DAT_00151b00;
    auVar49 = _DAT_00151af0;
    auVar48 = _DAT_00151ae0;
    if (uVar72 == 0) {
      lVar74 = 1;
    }
    else {
      uVar57 = 1;
      do {
        uVar67 = (ulong)local_c0.array_[uVar57];
        if ((long)uVar67 < (long)n) {
          sVar47 = uVar67 * 2;
          uVar64 = (ulong)((long)sVar47 < (long)n);
          sVar61 = sVar47;
          if ((long)sVar47 < (long)n) {
            sVar61 = n;
          }
          uVar58 = ((sVar61 - uVar64) + uVar67 * -2) / uVar67;
          lVar74 = uVar64 + uVar58;
          auVar119._8_4_ = (int)lVar74;
          auVar119._0_8_ = lVar74;
          auVar119._12_4_ = (int)((ulong)lVar74 >> 0x20);
          uVar73 = 0;
          pbVar71 = pbVar55;
          do {
            auVar112._8_4_ = (int)uVar73;
            auVar112._0_8_ = uVar73;
            auVar112._12_4_ = (int)(uVar73 >> 0x20);
            auVar117 = auVar119 ^ auVar54;
            auVar124 = (auVar112 | auVar53) ^ auVar54;
            iVar116 = auVar117._0_4_;
            iVar149 = -(uint)(iVar116 < auVar124._0_4_);
            iVar121 = auVar117._4_4_;
            auVar126._4_4_ = -(uint)(iVar121 < auVar124._4_4_);
            iVar122 = auVar117._8_4_;
            iVar156 = -(uint)(iVar122 < auVar124._8_4_);
            iVar123 = auVar117._12_4_;
            auVar126._12_4_ = -(uint)(iVar123 < auVar124._12_4_);
            auVar96._4_4_ = iVar149;
            auVar96._0_4_ = iVar149;
            auVar96._8_4_ = iVar156;
            auVar96._12_4_ = iVar156;
            auVar77 = pshuflw(auVar77,auVar96,0xe8);
            auVar125._4_4_ = -(uint)(auVar124._4_4_ == iVar121);
            auVar125._12_4_ = -(uint)(auVar124._12_4_ == iVar123);
            auVar125._0_4_ = auVar125._4_4_;
            auVar125._8_4_ = auVar125._12_4_;
            auVar96 = pshuflw(auVar78,auVar125,0xe8);
            auVar126._0_4_ = auVar126._4_4_;
            auVar126._8_4_ = auVar126._12_4_;
            auVar78 = pshuflw(auVar77,auVar126,0xe8);
            auVar117._8_4_ = 0xffffffff;
            auVar117._0_8_ = 0xffffffffffffffff;
            auVar117._12_4_ = 0xffffffff;
            auVar117 = (auVar78 | auVar96 & auVar77) ^ auVar117;
            auVar77 = packssdw(auVar117,auVar117);
            if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar71[uVar67] = false;
            }
            auVar20._4_4_ = iVar149;
            auVar20._0_4_ = iVar149;
            auVar20._8_4_ = iVar156;
            auVar20._12_4_ = iVar156;
            auVar126 = auVar125 & auVar20 | auVar126;
            auVar77 = packssdw(auVar126,auVar126);
            auVar124._8_4_ = 0xffffffff;
            auVar124._0_8_ = 0xffffffffffffffff;
            auVar124._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar124,auVar77 ^ auVar124);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._0_4_ >> 8 & 1) != 0) {
              pbVar71[sVar47] = false;
            }
            auVar77 = (auVar112 | auVar52) ^ auVar54;
            auVar97._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar97._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar97._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar97._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar127._4_4_ = auVar97._0_4_;
            auVar127._0_4_ = auVar97._0_4_;
            auVar127._8_4_ = auVar97._8_4_;
            auVar127._12_4_ = auVar97._8_4_;
            iVar149 = -(uint)(auVar77._4_4_ == iVar121);
            iVar156 = -(uint)(auVar77._12_4_ == iVar123);
            auVar21._4_4_ = iVar149;
            auVar21._0_4_ = iVar149;
            auVar21._8_4_ = iVar156;
            auVar21._12_4_ = iVar156;
            auVar150._4_4_ = auVar97._4_4_;
            auVar150._0_4_ = auVar97._4_4_;
            auVar150._8_4_ = auVar97._12_4_;
            auVar150._12_4_ = auVar97._12_4_;
            auVar77 = auVar21 & auVar127 | auVar150;
            auVar77 = packssdw(auVar77,auVar77);
            auVar1._8_4_ = 0xffffffff;
            auVar1._0_8_ = 0xffffffffffffffff;
            auVar1._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar1,auVar77 ^ auVar1);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
              pbVar71[uVar67 * 3] = false;
            }
            auVar77 = pshufhw(auVar77,auVar127,0x84);
            auVar22._4_4_ = iVar149;
            auVar22._0_4_ = iVar149;
            auVar22._8_4_ = iVar156;
            auVar22._12_4_ = iVar156;
            auVar117 = pshufhw(auVar97,auVar22,0x84);
            auVar78 = pshufhw(auVar77,auVar150,0x84);
            auVar79._8_4_ = 0xffffffff;
            auVar79._0_8_ = 0xffffffffffffffff;
            auVar79._12_4_ = 0xffffffff;
            auVar79 = (auVar78 | auVar117 & auVar77) ^ auVar79;
            auVar77 = packssdw(auVar79,auVar79);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._0_4_ >> 0x18 & 1) != 0) {
              pbVar71[uVar67 * 4] = false;
            }
            auVar77 = (auVar112 | auVar51) ^ auVar54;
            auVar98._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar98._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar98._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar98._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar23._4_4_ = auVar98._0_4_;
            auVar23._0_4_ = auVar98._0_4_;
            auVar23._8_4_ = auVar98._8_4_;
            auVar23._12_4_ = auVar98._8_4_;
            auVar117 = pshuflw(auVar150,auVar23,0xe8);
            auVar80._0_4_ = -(uint)(auVar77._0_4_ == iVar116);
            auVar80._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar80._8_4_ = -(uint)(auVar77._8_4_ == iVar122);
            auVar80._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar128._4_4_ = auVar80._4_4_;
            auVar128._0_4_ = auVar80._4_4_;
            auVar128._8_4_ = auVar80._12_4_;
            auVar128._12_4_ = auVar80._12_4_;
            auVar77 = pshuflw(auVar80,auVar128,0xe8);
            auVar129._4_4_ = auVar98._4_4_;
            auVar129._0_4_ = auVar98._4_4_;
            auVar129._8_4_ = auVar98._12_4_;
            auVar129._12_4_ = auVar98._12_4_;
            auVar78 = pshuflw(auVar98,auVar129,0xe8);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 & auVar117,(auVar78 | auVar77 & auVar117) ^ auVar2);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar71[uVar67 * 5] = false;
            }
            auVar24._4_4_ = auVar98._0_4_;
            auVar24._0_4_ = auVar98._0_4_;
            auVar24._8_4_ = auVar98._8_4_;
            auVar24._12_4_ = auVar98._8_4_;
            auVar129 = auVar128 & auVar24 | auVar129;
            auVar78 = packssdw(auVar129,auVar129);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77,auVar78 ^ auVar3);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._4_2_ >> 8 & 1) != 0) {
              pbVar71[uVar67 * 6] = false;
            }
            auVar77 = (auVar112 | auVar50) ^ auVar54;
            auVar99._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar99._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar99._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar99._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar130._4_4_ = auVar99._0_4_;
            auVar130._0_4_ = auVar99._0_4_;
            auVar130._8_4_ = auVar99._8_4_;
            auVar130._12_4_ = auVar99._8_4_;
            iVar149 = -(uint)(auVar77._4_4_ == iVar121);
            iVar156 = -(uint)(auVar77._12_4_ == iVar123);
            auVar25._4_4_ = iVar149;
            auVar25._0_4_ = iVar149;
            auVar25._8_4_ = iVar156;
            auVar25._12_4_ = iVar156;
            auVar151._4_4_ = auVar99._4_4_;
            auVar151._0_4_ = auVar99._4_4_;
            auVar151._8_4_ = auVar99._12_4_;
            auVar151._12_4_ = auVar99._12_4_;
            auVar77 = auVar25 & auVar130 | auVar151;
            auVar77 = packssdw(auVar77,auVar77);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar4,auVar77 ^ auVar4);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar71[uVar67 * 7] = false;
            }
            auVar77 = pshufhw(auVar77,auVar130,0x84);
            auVar26._4_4_ = iVar149;
            auVar26._0_4_ = iVar149;
            auVar26._8_4_ = iVar156;
            auVar26._12_4_ = iVar156;
            auVar117 = pshufhw(auVar99,auVar26,0x84);
            auVar78 = pshufhw(auVar77,auVar151,0x84);
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            auVar81 = (auVar78 | auVar117 & auVar77) ^ auVar81;
            auVar77 = packssdw(auVar81,auVar81);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._6_2_ >> 8 & 1) != 0) {
              pbVar71[uVar67 * 8] = false;
            }
            auVar77 = (auVar112 | auVar49) ^ auVar54;
            auVar100._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar100._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar100._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar100._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar27._4_4_ = auVar100._0_4_;
            auVar27._0_4_ = auVar100._0_4_;
            auVar27._8_4_ = auVar100._8_4_;
            auVar27._12_4_ = auVar100._8_4_;
            auVar117 = pshuflw(auVar151,auVar27,0xe8);
            auVar82._0_4_ = -(uint)(auVar77._0_4_ == iVar116);
            auVar82._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar82._8_4_ = -(uint)(auVar77._8_4_ == iVar122);
            auVar82._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar131._4_4_ = auVar82._4_4_;
            auVar131._0_4_ = auVar82._4_4_;
            auVar131._8_4_ = auVar82._12_4_;
            auVar131._12_4_ = auVar82._12_4_;
            auVar77 = pshuflw(auVar82,auVar131,0xe8);
            auVar132._4_4_ = auVar100._4_4_;
            auVar132._0_4_ = auVar100._4_4_;
            auVar132._8_4_ = auVar100._12_4_;
            auVar132._12_4_ = auVar100._12_4_;
            auVar78 = pshuflw(auVar100,auVar132,0xe8);
            auVar101._8_4_ = 0xffffffff;
            auVar101._0_8_ = 0xffffffffffffffff;
            auVar101._12_4_ = 0xffffffff;
            auVar101 = (auVar78 | auVar77 & auVar117) ^ auVar101;
            auVar78 = packssdw(auVar101,auVar101);
            auVar77 = packsswb(auVar77 & auVar117,auVar78);
            if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar71[uVar67 * 9] = false;
            }
            auVar28._4_4_ = auVar100._0_4_;
            auVar28._0_4_ = auVar100._0_4_;
            auVar28._8_4_ = auVar100._8_4_;
            auVar28._12_4_ = auVar100._8_4_;
            auVar132 = auVar131 & auVar28 | auVar132;
            auVar78 = packssdw(auVar132,auVar132);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar78 = packssdw(auVar78 ^ auVar5,auVar78 ^ auVar5);
            auVar77 = packsswb(auVar77,auVar78);
            if ((auVar77._8_2_ >> 8 & 1) != 0) {
              pbVar71[uVar67 * 10] = false;
            }
            auVar77 = (auVar112 | auVar48) ^ auVar54;
            auVar102._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar102._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar102._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar102._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar133._4_4_ = auVar102._0_4_;
            auVar133._0_4_ = auVar102._0_4_;
            auVar133._8_4_ = auVar102._8_4_;
            auVar133._12_4_ = auVar102._8_4_;
            iVar149 = -(uint)(auVar77._4_4_ == iVar121);
            iVar156 = -(uint)(auVar77._12_4_ == iVar123);
            auVar29._4_4_ = iVar149;
            auVar29._0_4_ = iVar149;
            auVar29._8_4_ = iVar156;
            auVar29._12_4_ = iVar156;
            auVar152._4_4_ = auVar102._4_4_;
            auVar152._0_4_ = auVar102._4_4_;
            auVar152._8_4_ = auVar102._12_4_;
            auVar152._12_4_ = auVar102._12_4_;
            auVar77 = auVar29 & auVar133 | auVar152;
            auVar77 = packssdw(auVar77,auVar77);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar6,auVar77 ^ auVar6);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pbVar71[uVar67 * 0xb] = false;
            }
            auVar77 = pshufhw(auVar77,auVar133,0x84);
            auVar30._4_4_ = iVar149;
            auVar30._0_4_ = iVar149;
            auVar30._8_4_ = iVar156;
            auVar30._12_4_ = iVar156;
            auVar117 = pshufhw(auVar102,auVar30,0x84);
            auVar78 = pshufhw(auVar77,auVar152,0x84);
            auVar83._8_4_ = 0xffffffff;
            auVar83._0_8_ = 0xffffffffffffffff;
            auVar83._12_4_ = 0xffffffff;
            auVar83 = (auVar78 | auVar117 & auVar77) ^ auVar83;
            auVar77 = packssdw(auVar83,auVar83);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._10_2_ >> 8 & 1) != 0) {
              pbVar71[uVar67 * 0xc] = false;
            }
            auVar77 = (auVar112 | _DAT_00151ad0) ^ auVar54;
            auVar103._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar103._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar103._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar103._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar31._4_4_ = auVar103._0_4_;
            auVar31._0_4_ = auVar103._0_4_;
            auVar31._8_4_ = auVar103._8_4_;
            auVar31._12_4_ = auVar103._8_4_;
            auVar117 = pshuflw(auVar152,auVar31,0xe8);
            auVar84._0_4_ = -(uint)(auVar77._0_4_ == iVar116);
            auVar84._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar84._8_4_ = -(uint)(auVar77._8_4_ == iVar122);
            auVar84._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar134._4_4_ = auVar84._4_4_;
            auVar134._0_4_ = auVar84._4_4_;
            auVar134._8_4_ = auVar84._12_4_;
            auVar134._12_4_ = auVar84._12_4_;
            auVar77 = pshuflw(auVar84,auVar134,0xe8);
            auVar135._4_4_ = auVar103._4_4_;
            auVar135._0_4_ = auVar103._4_4_;
            auVar135._8_4_ = auVar103._12_4_;
            auVar135._12_4_ = auVar103._12_4_;
            auVar78 = pshuflw(auVar103,auVar135,0xe8);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 & auVar117,(auVar78 | auVar77 & auVar117) ^ auVar7);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar71[uVar67 * 0xd] = false;
            }
            auVar32._4_4_ = auVar103._0_4_;
            auVar32._0_4_ = auVar103._0_4_;
            auVar32._8_4_ = auVar103._8_4_;
            auVar32._12_4_ = auVar103._8_4_;
            auVar135 = auVar134 & auVar32 | auVar135;
            auVar78 = packssdw(auVar135,auVar135);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77,auVar78 ^ auVar8);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._12_2_ >> 8 & 1) != 0) {
              pbVar71[uVar67 * 0xe] = false;
            }
            auVar77 = (auVar112 | _DAT_00151ac0) ^ auVar54;
            auVar85._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar85._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar85._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar85._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar136._4_4_ = auVar85._0_4_;
            auVar136._0_4_ = auVar85._0_4_;
            auVar136._8_4_ = auVar85._8_4_;
            auVar136._12_4_ = auVar85._8_4_;
            auVar113._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar113._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar113._0_4_ = auVar113._4_4_;
            auVar113._8_4_ = auVar113._12_4_;
            auVar118._4_4_ = auVar85._4_4_;
            auVar118._0_4_ = auVar85._4_4_;
            auVar118._8_4_ = auVar85._12_4_;
            auVar118._12_4_ = auVar85._12_4_;
            auVar78 = auVar113 & auVar136 | auVar118;
            auVar77 = packssdw(auVar85,auVar78);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar9,auVar77 ^ auVar9);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar71[uVar67 * 0xf] = false;
            }
            auVar77 = pshufhw(auVar77,auVar136,0x84);
            auVar78 = pshufhw(auVar78,auVar113,0x84);
            auVar78 = auVar78 & auVar77;
            auVar77 = pshufhw(auVar77,auVar118,0x84);
            auVar86._8_4_ = 0xffffffff;
            auVar86._0_8_ = 0xffffffffffffffff;
            auVar86._12_4_ = 0xffffffff;
            auVar86 = (auVar77 | auVar78) ^ auVar86;
            auVar77 = packssdw(auVar86,auVar86);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._14_2_ >> 8 & 1) != 0) {
              pbVar71[uVar67 * 0x10] = false;
            }
            uVar73 = uVar73 + 0x10;
            pbVar71 = pbVar71 + uVar67 * 0x10;
          } while ((uVar58 + uVar64 + 0x10 & 0xfffffffffffffff0) != uVar73);
        }
        bVar56 = uVar57 != uVar72;
        uVar57 = uVar57 + 1;
      } while (bVar56);
      lVar74 = uVar72 + 1;
    }
    auVar54 = _DAT_00151b40;
    auVar53 = _DAT_00151b30;
    auVar52 = _DAT_00151b20;
    auVar51 = _DAT_00151b10;
    auVar50 = _DAT_00151b00;
    auVar49 = _DAT_00151af0;
    auVar48 = _DAT_00151ae0;
    if (lVar74 < lVar63) {
      local_98 = local_c0.array_;
      lVar66 = 0;
      do {
        lVar68 = (long)local_c0.array_[lVar74];
        if ((long)uVar62 / lVar68 < (long)uVar62) {
          lVar70 = 0;
          lVar69 = 1;
          uVar72 = uVar62;
          do {
            lVar60 = lVar69;
            if (((long)local_78.array_[uVar72] != 0) &&
               (local_c0.array_[lVar74] < local_60.array_[uVar72])) {
              lVar59 = x / (long)(uVar72 * lVar68);
              if (lVar69 <= lVar59) {
                lVar60 = lVar59 + 1;
                do {
                  lVar70 = lVar70 + (ulong)pbVar55[lVar69];
                  lVar69 = lVar69 + 1;
                } while (lVar60 != lVar69);
              }
              lVar66 = lVar66 - local_78.array_[uVar72] * lVar70;
            }
            uVar72 = uVar72 - 1;
            lVar69 = lVar60;
          } while ((long)uVar62 / lVar68 < (long)uVar72);
        }
        if (lVar68 < (long)n) {
          sVar47 = lVar68 * 3;
          uVar72 = (ulong)((long)sVar47 < (long)n);
          sVar61 = sVar47;
          if ((long)sVar47 < (long)n) {
            sVar61 = n;
          }
          uVar57 = ((sVar61 - uVar72) + lVar68 * -3) / (ulong)(lVar68 * 2);
          lVar69 = uVar72 + uVar57;
          auVar111._8_4_ = (int)lVar69;
          auVar111._0_8_ = lVar69;
          auVar111._12_4_ = (int)((ulong)lVar69 >> 0x20);
          local_80 = lVar68 * 0xd;
          local_88 = lVar68 * 0xb;
          uVar67 = 0;
          pbVar71 = pbVar55;
          do {
            auVar114._8_4_ = (int)uVar67;
            auVar114._0_8_ = uVar67;
            auVar114._12_4_ = (int)(uVar67 >> 0x20);
            auVar119 = auVar111 ^ auVar54;
            auVar117 = (auVar114 | auVar53) ^ auVar54;
            iVar116 = auVar119._0_4_;
            iVar149 = -(uint)(iVar116 < auVar117._0_4_);
            iVar121 = auVar119._4_4_;
            auVar138._4_4_ = -(uint)(iVar121 < auVar117._4_4_);
            iVar122 = auVar119._8_4_;
            iVar156 = -(uint)(iVar122 < auVar117._8_4_);
            iVar123 = auVar119._12_4_;
            auVar138._12_4_ = -(uint)(iVar123 < auVar117._12_4_);
            auVar33._4_4_ = iVar149;
            auVar33._0_4_ = iVar149;
            auVar33._8_4_ = iVar156;
            auVar33._12_4_ = iVar156;
            auVar77 = pshuflw(auVar77,auVar33,0xe8);
            auVar137._4_4_ = -(uint)(auVar117._4_4_ == iVar121);
            auVar137._12_4_ = -(uint)(auVar117._12_4_ == iVar123);
            auVar137._0_4_ = auVar137._4_4_;
            auVar137._8_4_ = auVar137._12_4_;
            auVar119 = pshuflw(auVar78,auVar137,0xe8);
            auVar138._0_4_ = auVar138._4_4_;
            auVar138._8_4_ = auVar138._12_4_;
            auVar78 = pshuflw(auVar77,auVar138,0xe8);
            auVar87._8_4_ = 0xffffffff;
            auVar87._0_8_ = 0xffffffffffffffff;
            auVar87._12_4_ = 0xffffffff;
            auVar87 = (auVar78 | auVar119 & auVar77) ^ auVar87;
            auVar77 = packssdw(auVar87,auVar87);
            if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar71[lVar68] = false;
            }
            auVar34._4_4_ = iVar149;
            auVar34._0_4_ = iVar149;
            auVar34._8_4_ = iVar156;
            auVar34._12_4_ = iVar156;
            auVar138 = auVar137 & auVar34 | auVar138;
            auVar77 = packssdw(auVar138,auVar138);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar10,auVar77 ^ auVar10);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._0_4_ >> 8 & 1) != 0) {
              pbVar71[sVar47] = false;
            }
            auVar77 = (auVar114 | auVar52) ^ auVar54;
            auVar104._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar104._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar104._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar104._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar139._4_4_ = auVar104._0_4_;
            auVar139._0_4_ = auVar104._0_4_;
            auVar139._8_4_ = auVar104._8_4_;
            auVar139._12_4_ = auVar104._8_4_;
            iVar149 = -(uint)(auVar77._4_4_ == iVar121);
            iVar156 = -(uint)(auVar77._12_4_ == iVar123);
            auVar35._4_4_ = iVar149;
            auVar35._0_4_ = iVar149;
            auVar35._8_4_ = iVar156;
            auVar35._12_4_ = iVar156;
            auVar153._4_4_ = auVar104._4_4_;
            auVar153._0_4_ = auVar104._4_4_;
            auVar153._8_4_ = auVar104._12_4_;
            auVar153._12_4_ = auVar104._12_4_;
            auVar77 = auVar35 & auVar139 | auVar153;
            auVar77 = packssdw(auVar77,auVar77);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar11,auVar77 ^ auVar11);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
              pbVar71[lVar68 * 5] = false;
            }
            auVar77 = pshufhw(auVar77,auVar139,0x84);
            auVar36._4_4_ = iVar149;
            auVar36._0_4_ = iVar149;
            auVar36._8_4_ = iVar156;
            auVar36._12_4_ = iVar156;
            auVar119 = pshufhw(auVar104,auVar36,0x84);
            auVar78 = pshufhw(auVar77,auVar153,0x84);
            auVar88._8_4_ = 0xffffffff;
            auVar88._0_8_ = 0xffffffffffffffff;
            auVar88._12_4_ = 0xffffffff;
            auVar88 = (auVar78 | auVar119 & auVar77) ^ auVar88;
            auVar77 = packssdw(auVar88,auVar88);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._0_4_ >> 0x18 & 1) != 0) {
              pbVar71[lVar68 * 7] = false;
            }
            auVar77 = (auVar114 | auVar51) ^ auVar54;
            auVar105._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar105._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar105._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar105._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar37._4_4_ = auVar105._0_4_;
            auVar37._0_4_ = auVar105._0_4_;
            auVar37._8_4_ = auVar105._8_4_;
            auVar37._12_4_ = auVar105._8_4_;
            auVar119 = pshuflw(auVar153,auVar37,0xe8);
            auVar89._0_4_ = -(uint)(auVar77._0_4_ == iVar116);
            auVar89._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar89._8_4_ = -(uint)(auVar77._8_4_ == iVar122);
            auVar89._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar140._4_4_ = auVar89._4_4_;
            auVar140._0_4_ = auVar89._4_4_;
            auVar140._8_4_ = auVar89._12_4_;
            auVar140._12_4_ = auVar89._12_4_;
            auVar77 = pshuflw(auVar89,auVar140,0xe8);
            auVar141._4_4_ = auVar105._4_4_;
            auVar141._0_4_ = auVar105._4_4_;
            auVar141._8_4_ = auVar105._12_4_;
            auVar141._12_4_ = auVar105._12_4_;
            auVar78 = pshuflw(auVar105,auVar141,0xe8);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 & auVar119,(auVar78 | auVar77 & auVar119) ^ auVar12);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar71[lVar68 * 9] = false;
            }
            auVar38._4_4_ = auVar105._0_4_;
            auVar38._0_4_ = auVar105._0_4_;
            auVar38._8_4_ = auVar105._8_4_;
            auVar38._12_4_ = auVar105._8_4_;
            auVar141 = auVar140 & auVar38 | auVar141;
            auVar78 = packssdw(auVar141,auVar141);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77,auVar78 ^ auVar13);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._4_2_ >> 8 & 1) != 0) {
              pbVar71[local_88] = false;
            }
            auVar77 = (auVar114 | auVar50) ^ auVar54;
            auVar106._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar106._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar106._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar106._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar142._4_4_ = auVar106._0_4_;
            auVar142._0_4_ = auVar106._0_4_;
            auVar142._8_4_ = auVar106._8_4_;
            auVar142._12_4_ = auVar106._8_4_;
            iVar149 = -(uint)(auVar77._4_4_ == iVar121);
            iVar156 = -(uint)(auVar77._12_4_ == iVar123);
            auVar39._4_4_ = iVar149;
            auVar39._0_4_ = iVar149;
            auVar39._8_4_ = iVar156;
            auVar39._12_4_ = iVar156;
            auVar154._4_4_ = auVar106._4_4_;
            auVar154._0_4_ = auVar106._4_4_;
            auVar154._8_4_ = auVar106._12_4_;
            auVar154._12_4_ = auVar106._12_4_;
            auVar77 = auVar39 & auVar142 | auVar154;
            auVar77 = packssdw(auVar77,auVar77);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar14,auVar77 ^ auVar14);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar71[local_80] = false;
            }
            auVar77 = pshufhw(auVar77,auVar142,0x84);
            auVar40._4_4_ = iVar149;
            auVar40._0_4_ = iVar149;
            auVar40._8_4_ = iVar156;
            auVar40._12_4_ = iVar156;
            auVar119 = pshufhw(auVar106,auVar40,0x84);
            auVar78 = pshufhw(auVar77,auVar154,0x84);
            auVar90._8_4_ = 0xffffffff;
            auVar90._0_8_ = 0xffffffffffffffff;
            auVar90._12_4_ = 0xffffffff;
            auVar90 = (auVar78 | auVar119 & auVar77) ^ auVar90;
            auVar77 = packssdw(auVar90,auVar90);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._6_2_ >> 8 & 1) != 0) {
              pbVar71[lVar68 * 0xf] = false;
            }
            auVar77 = (auVar114 | auVar49) ^ auVar54;
            auVar107._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar107._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar107._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar107._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar41._4_4_ = auVar107._0_4_;
            auVar41._0_4_ = auVar107._0_4_;
            auVar41._8_4_ = auVar107._8_4_;
            auVar41._12_4_ = auVar107._8_4_;
            auVar119 = pshuflw(auVar154,auVar41,0xe8);
            auVar91._0_4_ = -(uint)(auVar77._0_4_ == iVar116);
            auVar91._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar91._8_4_ = -(uint)(auVar77._8_4_ == iVar122);
            auVar91._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar143._4_4_ = auVar91._4_4_;
            auVar143._0_4_ = auVar91._4_4_;
            auVar143._8_4_ = auVar91._12_4_;
            auVar143._12_4_ = auVar91._12_4_;
            auVar77 = pshuflw(auVar91,auVar143,0xe8);
            auVar144._4_4_ = auVar107._4_4_;
            auVar144._0_4_ = auVar107._4_4_;
            auVar144._8_4_ = auVar107._12_4_;
            auVar144._12_4_ = auVar107._12_4_;
            auVar78 = pshuflw(auVar107,auVar144,0xe8);
            auVar108._8_4_ = 0xffffffff;
            auVar108._0_8_ = 0xffffffffffffffff;
            auVar108._12_4_ = 0xffffffff;
            auVar108 = (auVar78 | auVar77 & auVar119) ^ auVar108;
            auVar78 = packssdw(auVar108,auVar108);
            auVar77 = packsswb(auVar77 & auVar119,auVar78);
            if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pbVar71[lVar68 * 0x11] = false;
            }
            auVar42._4_4_ = auVar107._0_4_;
            auVar42._0_4_ = auVar107._0_4_;
            auVar42._8_4_ = auVar107._8_4_;
            auVar42._12_4_ = auVar107._8_4_;
            auVar144 = auVar143 & auVar42 | auVar144;
            auVar78 = packssdw(auVar144,auVar144);
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            auVar78 = packssdw(auVar78 ^ auVar15,auVar78 ^ auVar15);
            auVar77 = packsswb(auVar77,auVar78);
            if ((auVar77._8_2_ >> 8 & 1) != 0) {
              pbVar71[lVar68 * 0x13] = false;
            }
            auVar77 = (auVar114 | auVar48) ^ auVar54;
            auVar109._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar109._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar109._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar109._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar145._4_4_ = auVar109._0_4_;
            auVar145._0_4_ = auVar109._0_4_;
            auVar145._8_4_ = auVar109._8_4_;
            auVar145._12_4_ = auVar109._8_4_;
            iVar149 = -(uint)(auVar77._4_4_ == iVar121);
            iVar156 = -(uint)(auVar77._12_4_ == iVar123);
            auVar43._4_4_ = iVar149;
            auVar43._0_4_ = iVar149;
            auVar43._8_4_ = iVar156;
            auVar43._12_4_ = iVar156;
            auVar155._4_4_ = auVar109._4_4_;
            auVar155._0_4_ = auVar109._4_4_;
            auVar155._8_4_ = auVar109._12_4_;
            auVar155._12_4_ = auVar109._12_4_;
            auVar77 = auVar43 & auVar145 | auVar155;
            auVar77 = packssdw(auVar77,auVar77);
            auVar16._8_4_ = 0xffffffff;
            auVar16._0_8_ = 0xffffffffffffffff;
            auVar16._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar16,auVar77 ^ auVar16);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pbVar71[lVar68 * 0x15] = false;
            }
            auVar77 = pshufhw(auVar77,auVar145,0x84);
            auVar44._4_4_ = iVar149;
            auVar44._0_4_ = iVar149;
            auVar44._8_4_ = iVar156;
            auVar44._12_4_ = iVar156;
            auVar119 = pshufhw(auVar109,auVar44,0x84);
            auVar78 = pshufhw(auVar77,auVar155,0x84);
            auVar92._8_4_ = 0xffffffff;
            auVar92._0_8_ = 0xffffffffffffffff;
            auVar92._12_4_ = 0xffffffff;
            auVar92 = (auVar78 | auVar119 & auVar77) ^ auVar92;
            auVar77 = packssdw(auVar92,auVar92);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._10_2_ >> 8 & 1) != 0) {
              pbVar71[lVar68 * 0x17] = false;
            }
            auVar77 = (auVar114 | _DAT_00151ad0) ^ auVar54;
            auVar110._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar110._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar110._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar110._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar45._4_4_ = auVar110._0_4_;
            auVar45._0_4_ = auVar110._0_4_;
            auVar45._8_4_ = auVar110._8_4_;
            auVar45._12_4_ = auVar110._8_4_;
            auVar119 = pshuflw(auVar155,auVar45,0xe8);
            auVar93._0_4_ = -(uint)(auVar77._0_4_ == iVar116);
            auVar93._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar93._8_4_ = -(uint)(auVar77._8_4_ == iVar122);
            auVar93._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar146._4_4_ = auVar93._4_4_;
            auVar146._0_4_ = auVar93._4_4_;
            auVar146._8_4_ = auVar93._12_4_;
            auVar146._12_4_ = auVar93._12_4_;
            auVar77 = pshuflw(auVar93,auVar146,0xe8);
            auVar147._4_4_ = auVar110._4_4_;
            auVar147._0_4_ = auVar110._4_4_;
            auVar147._8_4_ = auVar110._12_4_;
            auVar147._12_4_ = auVar110._12_4_;
            auVar78 = pshuflw(auVar110,auVar147,0xe8);
            auVar17._8_4_ = 0xffffffff;
            auVar17._0_8_ = 0xffffffffffffffff;
            auVar17._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 & auVar119,(auVar78 | auVar77 & auVar119) ^ auVar17);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pbVar71[lVar68 * 0x19] = false;
            }
            auVar46._4_4_ = auVar110._0_4_;
            auVar46._0_4_ = auVar110._0_4_;
            auVar46._8_4_ = auVar110._8_4_;
            auVar46._12_4_ = auVar110._8_4_;
            auVar147 = auVar146 & auVar46 | auVar147;
            auVar78 = packssdw(auVar147,auVar147);
            auVar18._8_4_ = 0xffffffff;
            auVar18._0_8_ = 0xffffffffffffffff;
            auVar18._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77,auVar78 ^ auVar18);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._12_2_ >> 8 & 1) != 0) {
              pbVar71[lVar68 * 0x1b] = false;
            }
            auVar77 = (auVar114 | _DAT_00151ac0) ^ auVar54;
            auVar94._0_4_ = -(uint)(iVar116 < auVar77._0_4_);
            auVar94._4_4_ = -(uint)(iVar121 < auVar77._4_4_);
            auVar94._8_4_ = -(uint)(iVar122 < auVar77._8_4_);
            auVar94._12_4_ = -(uint)(iVar123 < auVar77._12_4_);
            auVar148._4_4_ = auVar94._0_4_;
            auVar148._0_4_ = auVar94._0_4_;
            auVar148._8_4_ = auVar94._8_4_;
            auVar148._12_4_ = auVar94._8_4_;
            auVar115._4_4_ = -(uint)(auVar77._4_4_ == iVar121);
            auVar115._12_4_ = -(uint)(auVar77._12_4_ == iVar123);
            auVar115._0_4_ = auVar115._4_4_;
            auVar115._8_4_ = auVar115._12_4_;
            auVar120._4_4_ = auVar94._4_4_;
            auVar120._0_4_ = auVar94._4_4_;
            auVar120._8_4_ = auVar94._12_4_;
            auVar120._12_4_ = auVar94._12_4_;
            auVar78 = auVar115 & auVar148 | auVar120;
            auVar77 = packssdw(auVar94,auVar78);
            auVar19._8_4_ = 0xffffffff;
            auVar19._0_8_ = 0xffffffffffffffff;
            auVar19._12_4_ = 0xffffffff;
            auVar77 = packssdw(auVar77 ^ auVar19,auVar77 ^ auVar19);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pbVar71[lVar68 * 0x1d] = false;
            }
            auVar77 = pshufhw(auVar77,auVar148,0x84);
            auVar78 = pshufhw(auVar78,auVar115,0x84);
            auVar78 = auVar78 & auVar77;
            auVar77 = pshufhw(auVar77,auVar120,0x84);
            auVar95._8_4_ = 0xffffffff;
            auVar95._0_8_ = 0xffffffffffffffff;
            auVar95._12_4_ = 0xffffffff;
            auVar95 = (auVar77 | auVar78) ^ auVar95;
            auVar77 = packssdw(auVar95,auVar95);
            auVar77 = packsswb(auVar77,auVar77);
            if ((auVar77._14_2_ >> 8 & 1) != 0) {
              pbVar71[lVar68 * 0x1f] = false;
            }
            uVar67 = uVar67 + 0x10;
            pbVar71 = pbVar71 + lVar68 * 0x20;
          } while ((uVar57 + uVar72 + 0x10 & 0xfffffffffffffff0) != uVar67);
        }
        lVar74 = lVar74 + 1;
        local_90 = lVar66;
      } while (lVar74 != lVar63);
    }
    else {
      lVar66 = 0;
    }
    operator_delete(pbVar55,(long)local_48.capacity_ - (long)pbVar55);
    iVar65 = local_a0 + lVar66 + lVar63 + ~local_a8;
    operator_delete(local_78.array_,(long)local_78.capacity_ - (long)local_78.array_);
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_c0.array_,(long)local_c0.capacity_ - (long)local_c0.array_);
  }
  return iVar65;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads);
  int64_t s2 = S2(x, y, c, pi_y, primes, lpf, mu);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}